

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpegVideo.cpp
# Opt level: O1

uint8_t * __thiscall
MPEGSequenceHeader::deserializeDisplayExtension(MPEGSequenceHeader *this,BitStreamReader *bitReader)

{
  uint *puVar1;
  bool bVar2;
  uint uVar3;
  
  uVar3 = BitStreamReader::getBits(bitReader,3);
  this->video_format = (uint8_t)uVar3;
  bVar2 = BitStreamReader::getBit(bitReader);
  if (bVar2) {
    uVar3 = BitStreamReader::getBits(bitReader,8);
    this->color_primaries = (uint8_t)uVar3;
    uVar3 = BitStreamReader::getBits(bitReader,8);
    this->transfer_characteristics = (uint8_t)uVar3;
    uVar3 = BitStreamReader::getBits(bitReader,8);
    this->matrix_coefficients = (uint8_t)uVar3;
  }
  uVar3 = BitStreamReader::getBits(bitReader,0xe);
  this->pan_scan_width = uVar3 << 4;
  BitStreamReader::skipBit(bitReader);
  uVar3 = BitStreamReader::getBits(bitReader,0xe);
  this->pan_scan_height = uVar3 << 4;
  BitStreamReader::skipBit(bitReader);
  puVar1 = (bitReader->super_BitStream).m_initBuffer;
  return (uint8_t *)
         ((long)((int)(((*(int *)&(bitReader->super_BitStream).m_buffer - (int)puVar1) * 8 -
                        bitReader->m_bitLeft | 7) + 0x21) >> 3) + (long)puVar1);
}

Assistant:

uint8_t* MPEGSequenceHeader::deserializeDisplayExtension(BitStreamReader& bitReader)
{
    // MpegEncContext *s= &s1->mpeg_enc_ctx;
    video_format = bitReader.getBits<uint8_t>(3); /* video format */

    if (bitReader.getBit())  // color_description
    {
        color_primaries = bitReader.getBits<uint8_t>(8);          /* color primaries */
        transfer_characteristics = bitReader.getBits<uint8_t>(8); /* transfer_characteristics */
        matrix_coefficients = bitReader.getBits<uint8_t>(8);      /* matrix_coefficients */
    }

    pan_scan_width = bitReader.getBits(14) << 4;
    bitReader.skipBit();  // marker
    pan_scan_height = bitReader.getBits(14) << 4;
    bitReader.skipBit();  // marker

    // return bitContext.buffer_ptr;
    return skipProcessedBytes(bitReader);
}